

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void setup::anon_unknown_21::load_wizard_images
               (istream *is,version *version,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *images,entry_types entries)

{
  uint uVar1;
  _Base_bitset<1UL> __new_size;
  _Base_bitset<1UL> this;
  TypesafeBoolean p_Var2;
  slice_reader *p;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int_adapter<unsigned_int> *in_RSI;
  binary_string *in_RDI;
  size_t i_1;
  size_t i;
  size_t count;
  undefined8 in_stack_ffffffffffffffa8;
  binary_string *str;
  istream *in_stack_ffffffffffffffb0;
  istream *is_00;
  _Base_bitset<1UL> in_stack_ffffffffffffffb8;
  istream *local_40;
  istream *local_28;
  
  local_28 = (istream *)0x1;
  uVar1 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI);
  if (0x505ffff < uVar1) {
    uVar1 = util::load<unsigned_int>((istream *)0x1799cc);
    local_28 = (istream *)(ulong)uVar1;
  }
  __new_size._M_w =
       (_WordT)operator|((enum_type)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                         (enum_type)in_stack_ffffffffffffffa8);
  this._M_w = (_WordT)flags<setup::directory_entry::flags_Enum_,_5UL>::operator&
                                ((flags<setup::directory_entry::flags_Enum_,_5UL> *)
                                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8._M_w);
  p_Var2 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x179a05);
  if (p_Var2 == (TypesafeBoolean)0x0) {
    for (is_00 = (istream *)0x0; is_00 < local_28;
        is_00 = (istream *)((long)&is_00->_vptr_basic_istream + 1)) {
      util::binary_string::skip(is_00);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this._M_w,__new_size._M_w);
    for (local_40 = (istream *)0x0; local_40 < local_28;
        local_40 = (istream *)((long)&local_40->_vptr_basic_istream + 1)) {
      str = in_RDI;
      p = (slice_reader *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](in_RDX,(size_type)local_40);
      boost::unordered::iterator_detail::
      iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
                ((iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>
                  *)&stack0xffffffffffffffb8,p);
      util::operator>>(in_stack_ffffffffffffffb0,str);
    }
    uVar1 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI);
    if (uVar1 < 0x5060000) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDX,0);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x179aad);
      }
    }
  }
  return;
}

Assistant:

void load_wizard_images(std::istream & is, const setup::version & version,
                        std::vector<std::string> & images, info::entry_types entries) {
	
	size_t count = 1;
	if(version >= INNO_VERSION(5, 6, 0)) {
		count = util::load<boost::uint32_t>(is);
	}
	
	if(entries & (info::WizardImages | info::NoSkip)) {
		images.resize(count);
		for(size_t i = 0; i < count; i++) {
			is >> util::binary_string(images[i]);
		}
		if(version < INNO_VERSION(5, 6, 0) && images[0].empty()) {
			images.clear();
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			util::binary_string::skip(is);
		}
	}
	
}